

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSModuleDef * js_module_loader(JSContext *ctx,char *module_name,void *opaque)

{
  int iVar1;
  size_t in_RAX;
  char *pcVar2;
  long lVar3;
  code *pcVar4;
  JSModuleDef *pJVar5;
  uint8_t *input;
  JSValueUnion JVar6;
  size_t sVar7;
  int64_t extraout_RDX;
  JSRefCountHeader *p;
  JSValue func_val;
  JSValue v;
  size_t buf_len;
  size_t local_28;
  
  local_28 = in_RAX;
  iVar1 = has_suffix(module_name,".so");
  if (iVar1 == 0) {
    input = js_load_file(ctx,&local_28,module_name);
    if (input == (uint8_t *)0x0) {
      JS_ThrowReferenceError(ctx,"could not load module filename \'%s\'",module_name);
    }
    else {
      v = JS_Eval(ctx,(char *)input,local_28,module_name,0x21);
      JVar6 = v.u;
      js_free(ctx,input);
      if ((uint)v.tag != 6) {
        func_val.tag = extraout_RDX;
        func_val.u.ptr = JVar6.ptr;
        js_module_set_import_meta(ctx,func_val,1,0);
        if ((uint)v.tag < 0xfffffff5) {
          return (JSModuleDef *)JVar6.float64;
        }
        iVar1 = *JVar6.ptr;
        *(int *)JVar6.ptr = iVar1 + -1;
        if (1 < iVar1) {
          return (JSModuleDef *)JVar6.float64;
        }
        __JS_FreeValue(ctx,v);
        return (JSModuleDef *)JVar6.float64;
      }
    }
  }
  else {
    pcVar2 = strchr(module_name,0x2f);
    if (pcVar2 == (char *)0x0) {
      sVar7 = strlen(module_name);
      pcVar2 = (char *)js_malloc(ctx,sVar7 + 3);
      if (pcVar2 == (char *)0x0) {
        return (JSModuleDef *)0x0;
      }
      pcVar2[2] = '\0';
      pcVar2[0] = '.';
      pcVar2[1] = '/';
      strcpy(pcVar2 + 2,module_name);
      lVar3 = dlopen(pcVar2,2);
      if (pcVar2 != module_name) {
        js_free(ctx,pcVar2);
      }
    }
    else {
      lVar3 = dlopen(module_name,2);
    }
    if (lVar3 == 0) {
      JS_ThrowReferenceError
                (ctx,"could not load module filename \'%s\' as shared library",module_name);
    }
    else {
      pcVar4 = (code *)dlsym(lVar3,"js_init_module");
      if (pcVar4 == (code *)0x0) {
        pcVar2 = "could not load module filename \'%s\': js_init_module not found";
      }
      else {
        pJVar5 = (JSModuleDef *)(*pcVar4)(ctx,module_name);
        if (pJVar5 != (JSModuleDef *)0x0) {
          return pJVar5;
        }
        pcVar2 = "could not load module filename \'%s\': initialization error";
      }
      JS_ThrowReferenceError(ctx,pcVar2,module_name);
      dlclose(lVar3);
    }
  }
  return (JSModuleDef *)0x0;
}

Assistant:

JSModuleDef *js_module_loader(JSContext *ctx,
                              const char *module_name, void *opaque)
{
    JSModuleDef *m;

    if (has_suffix(module_name, ".so")) {
        m = js_module_loader_so(ctx, module_name);
    } else {
        size_t buf_len;
        uint8_t *buf;
        JSValue func_val;
    
        buf = js_load_file(ctx, &buf_len, module_name);
        if (!buf) {
            JS_ThrowReferenceError(ctx, "could not load module filename '%s'",
                                   module_name);
            return NULL;
        }
        
        /* compile the module */
        func_val = JS_Eval(ctx, (char *)buf, buf_len, module_name,
                           JS_EVAL_TYPE_MODULE | JS_EVAL_FLAG_COMPILE_ONLY);
        js_free(ctx, buf);
        if (JS_IsException(func_val))
            return NULL;
        /* XXX: could propagate the exception */
        js_module_set_import_meta(ctx, func_val, TRUE, FALSE);
        /* the module is already referenced, so we must free it */
        m = JS_VALUE_GET_PTR(func_val);
        JS_FreeValue(ctx, func_val);
    }
    return m;
}